

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O0

void __thiscall CHud::RenderScoreHud(CHud *this)

{
  anon_union_4_2_947300d3_for_vector4_base<float>_3 aVar1;
  undefined8 uVar2;
  vec2 CursorPosition;
  vec2 CursorPosition_00;
  int iVar3;
  int iVar4;
  int iVar5;
  ITextRender *pIVar6;
  IGraphics *pIVar7;
  IClient *pIVar8;
  CConfig *pCVar9;
  CUI *pCVar10;
  undefined8 *puVar11;
  long in_RDI;
  long in_FS_OFFSET;
  bool bVar12;
  float fVar13;
  float extraout_XMM0_Da;
  float fVar14;
  float fVar15;
  float fVar16;
  float b;
  float AdvanceID_1;
  float y_1;
  float x_1;
  float w_2;
  int ID_1;
  float Spacing;
  int t_5;
  float w_1;
  float PosSize;
  float ImageSize_1;
  float Split_1;
  float ScoreWidthMax_1;
  int t_4;
  float FontSize;
  int t_3;
  int i;
  int Local;
  float AdvanceID;
  float y;
  float x;
  float w;
  int ID;
  int BlinkTimer;
  int t_2;
  int t_1;
  float ImageSize;
  float Split;
  float ScoreWidthMax;
  int t;
  float TeamOffset;
  float StartY;
  float Whole;
  int GameFlags;
  CUIRect Rect_1;
  CQuadItem QuadItem;
  CUIRect Rect;
  CTeeRenderInfo Info_1;
  char aName_1 [64];
  char aBuf_2 [32];
  char aBuf_1 [32];
  CPlayerInfoItem aPlayerInfo [2];
  int aPos [2];
  CTeeRenderInfo Info;
  char aName [64];
  int FlagDropTick [2];
  int FlagCarrier [2];
  char aBuf [32];
  int Teamscores [2];
  char aScoreTeam [2] [32];
  float in_stack_fffffffffffff9d8;
  float in_stack_fffffffffffff9dc;
  int in_stack_fffffffffffff9e0;
  int in_stack_fffffffffffff9e4;
  int in_stack_fffffffffffff9e8;
  int in_stack_fffffffffffff9ec;
  CTextCursor *in_stack_fffffffffffff9f0;
  float in_stack_fffffffffffff9f8;
  anon_union_4_2_947300d3_for_vector4_base<float>_3 in_stack_fffffffffffff9fc;
  CTextCursor *in_stack_fffffffffffffa00;
  vec4 *in_stack_fffffffffffffa08;
  vector4_base<float> *this_00;
  undefined8 in_stack_fffffffffffffa10;
  CTextCursor *pCVar17;
  undefined4 in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa1c;
  uint uVar18;
  anon_union_4_2_94730284_for_vector2_base<float>_1 in_stack_fffffffffffffa20;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar19;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 in_stack_fffffffffffffa24;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar20;
  char *local_5c0;
  char *in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa50;
  float in_stack_fffffffffffffa54;
  CTextCursor *in_stack_fffffffffffffa58;
  char *local_590;
  int in_stack_fffffffffffffaa4;
  CTeeRenderInfo *in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab4;
  CTextCursor *in_stack_fffffffffffffab8;
  CTextCursor *local_540;
  CTextCursor *local_530;
  float local_524;
  char *local_4c8;
  vec2 in_stack_fffffffffffffb60;
  vec2 in_stack_fffffffffffffb68;
  float local_470;
  CTextCursor *local_440;
  CTextCursor *local_430;
  int local_3f8;
  int local_3e0;
  int local_3d8;
  int local_3d4;
  int local_3d0;
  int local_3b4;
  int local_3b0;
  int local_3a0;
  float local_38c;
  vector2_base<float> local_378;
  vector2_base<float> local_370;
  vector4_base<float> local_368;
  undefined1 local_358 [24];
  vector4_base<float> local_340;
  float local_330;
  float local_32c;
  float local_328;
  undefined4 local_324;
  vector2_base<float> local_320;
  vector2_base<float> local_318;
  vector4_base<float> local_310;
  vector4_base<float> local_300;
  vector2_base<float> local_2f0;
  CQuadItem local_2e8;
  uint local_2d8;
  vector4_base<float> local_2d4;
  float local_2c4;
  float local_2c0;
  float local_2bc;
  undefined4 local_2b8;
  undefined1 local_2b4 [148];
  float local_220;
  char local_218 [64];
  char local_1d8 [32];
  CTeeRenderInfo local_1b8;
  float local_d0;
  char local_c8 [64];
  int local_88 [4];
  char local_78 [40];
  uint local_50;
  uint local_4c;
  char local_48 [32];
  char acStack_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(uint *)(*(long *)(*(long *)(in_RDI + 8) + 0xdf8) + 4) & 0xc) == 0) {
    uVar18 = *(uint *)(*(long *)(in_RDI + 8) + 0x1b15c);
    CComponent::Graphics((CComponent *)0x16437c);
    fVar13 = IGraphics::ScreenAspect
                       ((IGraphics *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0));
    fVar13 = fVar13 * 300.0;
    local_38c = 229.0;
    if ((((uVar18 & 1) == 0) || (*(long *)(*(long *)(in_RDI + 8) + 0xe00) == 0)) ||
       ((uVar18 & 8) != 0)) {
      local_3d0 = -1;
      local_1b8.m_aColors[1].field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x1;
      local_1b8.m_aColors[1].field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x2;
      memset(&local_1b8.m_HatSpriteIndex,0,0x20);
      local_3d4 = 0;
      local_3d8 = 0;
      while( true ) {
        bVar12 = false;
        if ((local_3d8 < 2) && (bVar12 = false, local_3d4 < 0x40)) {
          bVar12 = *(long *)(*(long *)(in_RDI + 8) + 0x1228 + (long)local_3d4 * 0x10) != 0;
        }
        if (!bVar12) break;
        if (*(int *)(*(long *)(in_RDI + 8) +
                     (long)*(int *)(*(long *)(in_RDI + 8) + (long)local_3d4 * 0x10 + 0x1230) * 0x5b0
                    + 0x4848) != -1) {
          puVar11 = (undefined8 *)(*(long *)(in_RDI + 8) + 0x1228 + (long)local_3d4 * 0x10);
          *(undefined8 *)&local_1b8.m_aColors[(long)local_3d8 + -2].field_3 = *puVar11;
          uVar2 = puVar11[1];
          local_1b8.m_aColors[(long)local_3d8 + -1].field_1 =
               (anon_union_4_2_947300d3_for_vector4_base<float>_3)(int)uVar2;
          local_1b8.m_aColors[(long)local_3d8 + -1].field_2 =
               (anon_union_4_2_94730039_for_vector4_base<float>_5)(int)((ulong)uVar2 >> 0x20);
          if (local_1b8.m_aColors[(long)local_3d8 + -1].field_1 ==
              *(anon_union_4_2_947300d3_for_vector4_base<float>_3 *)
               (*(long *)(in_RDI + 8) + 0x1b140)) {
            local_3d0 = local_3d8;
          }
          local_3d8 = local_3d8 + 1;
        }
        local_3d4 = local_3d4 + 1;
      }
      if (((local_3d0 == -1) && (*(int *)(*(long *)(in_RDI + 8) + 0x1b140) != -1)) &&
         (*(int *)(*(long *)(in_RDI + 8) + (long)*(int *)(*(long *)(in_RDI + 8) + 0x1b140) * 0x5b0 +
                  0x4848) != -1)) {
        while( true ) {
          bVar12 = false;
          if (local_3d4 < 0x40) {
            bVar12 = *(long *)(*(long *)(in_RDI + 8) + 0x1228 + (long)local_3d4 * 0x10) != 0;
          }
          if (!bVar12) goto LAB_0016590b;
          if (*(int *)(*(long *)(in_RDI + 8) +
                       (long)*(int *)(*(long *)(in_RDI + 8) + (long)local_3d4 * 0x10 + 0x1230) *
                       0x5b0 + 0x4848) != -1) {
            local_1b8.m_aColors[1].field_3.w = local_1b8.m_aColors[1].field_3.w + 1;
          }
          if (*(int *)(*(long *)(in_RDI + 8) + (long)local_3d4 * 0x10 + 0x1230) ==
              *(int *)(*(long *)(in_RDI + 8) + 0x1b140)) break;
          local_3d4 = local_3d4 + 1;
        }
        puVar11 = (undefined8 *)(*(long *)(in_RDI + 8) + 0x1228 + (long)local_3d4 * 0x10);
        local_1b8._48_8_ = *puVar11;
        local_1b8.m_aColors[0]._4_8_ = puVar11[1];
        local_3d0 = 1;
      }
LAB_0016590b:
      local_524 = 10.0;
      if ((uVar18 & 8) == 0) {
        local_524 = 14.0;
      }
      local_540 = in_stack_fffffffffffffab8;
      if ((RenderScoreHud()::s_ScoreCursors == '\0') &&
         (iVar3 = __cxa_guard_acquire(&RenderScoreHud()::s_ScoreCursors),
         local_540 = in_stack_fffffffffffffab8, iVar3 != 0)) {
        local_530 = RenderScoreHud::s_ScoreCursors;
        do {
          CTextCursor::CTextCursor(in_stack_fffffffffffff9f0);
          local_530 = local_530 + 1;
        } while (local_530 != (CTextCursor *)&RenderScoreHud()::s_ScoreCursors);
        __cxa_atexit(__cxx_global_array_dtor_15,0,&__dso_handle);
        __cxa_guard_release(&RenderScoreHud()::s_ScoreCursors);
      }
      if ((RenderScoreHud()::s_PositionCursors == '\0') &&
         (iVar3 = __cxa_guard_acquire(&RenderScoreHud()::s_PositionCursors), iVar3 != 0)) {
        local_540 = RenderScoreHud::s_PositionCursors;
        pCVar17 = local_540;
        do {
          local_540 = pCVar17;
          CTextCursor::CTextCursor(in_stack_fffffffffffff9f0);
          pCVar17 = local_540 + 1;
        } while (local_540 + 1 != (CTextCursor *)&RenderScoreHud()::s_PositionCursors);
        __cxa_atexit(__cxx_global_array_dtor_16,0,&__dso_handle);
        __cxa_guard_release(&RenderScoreHud()::s_PositionCursors);
      }
      for (local_3e0 = 0; local_3e0 < 2; local_3e0 = local_3e0 + 1) {
        RenderScoreHud::s_ScoreCursors[local_3e0].m_FontSize = local_524;
        if (*(long *)&local_1b8.m_aColors[(long)local_3e0 + -2].field_3 == 0) {
          local_1b8.m_aTextures[0].m_Id._0_1_ = 0;
          CTextCursor::Reset((CTextCursor *)
                             CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                             CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
        }
        else {
          if ((uVar18 & 8) == 0) {
            str_format((char *)&local_1b8,0x20,"%d",
                       (ulong)*(uint *)(*(long *)&local_1b8.m_aColors[(long)local_3e0 + -2].field_3
                                       + 4));
          }
          else {
            in_stack_fffffffffffffaa8 = &local_1b8;
            in_stack_fffffffffffffab4 =
                 *(undefined4 *)(*(long *)&local_1b8.m_aColors[(long)local_3e0 + -2].field_3 + 4);
            CGameClient::RacePrecision(*(CGameClient **)(in_RDI + 8));
            FormatTime((char *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                       (int)in_stack_fffffffffffff9dc,(int)in_stack_fffffffffffff9d8,0);
          }
          CTextCursor::Reset((CTextCursor *)
                             CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                             CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
        }
        pIVar6 = CComponent::TextRender((CComponent *)0x165cf6);
        (*(pIVar6->super_IInterface)._vptr_IInterface[7])
                  (pIVar6,RenderScoreHud::s_ScoreCursors + local_3e0,&local_1b8,0xffffffff);
        CTextCursor::Reset((CTextCursor *)
                           CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                           CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
        str_format((char *)&local_1b8,0x20,"%d.",
                   (ulong)(uint)(&local_1b8.m_aColors[1].field_2)[local_3e0]);
        RenderScoreHud::s_PositionCursors[local_3e0].m_FontSize = 10.0;
        pIVar6 = CComponent::TextRender((CComponent *)0x165d9b);
        (*(pIVar6->super_IInterface)._vptr_IInterface[7])
                  (pIVar6,RenderScoreHud::s_PositionCursors + local_3e0,&local_1b8,0xffffffff);
      }
      fVar14 = CTextCursor::Width(RenderScoreHud::s_ScoreCursors);
      fVar15 = CTextCursor::Width(RenderScoreHud::s_ScoreCursors + 1);
      fVar14 = maximum<float>(fVar14,fVar15);
      pIVar6 = CComponent::TextRender((CComponent *)0x165e29);
      (*(pIVar6->super_IInterface)._vptr_IInterface[6])
                ((ulong)(uint)local_524,pIVar6,"10",0xffffffff);
      fVar14 = maximum<float>(fVar14,b);
      if ((uVar18 & 4) != 0) {
        if ((RenderScoreHud()::s_PlayerCountCursor == '\0') &&
           (iVar3 = __cxa_guard_acquire(&RenderScoreHud()::s_PlayerCountCursor), iVar3 != 0)) {
          CTextCursor::CTextCursor
                    (in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc.y,
                     (int)in_stack_fffffffffffff9f8);
          __cxa_atexit(CTextCursor::~CTextCursor,&RenderScoreHud::s_PlayerCountCursor,&__dso_handle)
          ;
          __cxa_guard_release(&RenderScoreHud()::s_PlayerCountCursor);
        }
        if (*(int *)(*(long *)(in_RDI + 8) + 0xe20) == 1) {
          local_590 = Localize((char *)in_stack_fffffffffffff9f0,
                               (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8)
                              );
        }
        else {
          local_590 = Localize((char *)in_stack_fffffffffffff9f0,
                               (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8)
                              );
        }
        str_format(local_1d8,0x20,local_590,(ulong)*(uint *)(*(long *)(in_RDI + 8) + 0xe20));
        CLocalizationDatabase::Version(&g_Localization);
        CTextCursor::Reset((CTextCursor *)
                           CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                           CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
        pIVar6 = CComponent::TextRender((CComponent *)0x165fc7);
        (*(pIVar6->super_IInterface)._vptr_IInterface[7])
                  (pIVar6,&RenderScoreHud::s_PlayerCountCursor,local_1d8,0xffffffff);
        fVar15 = CTextCursor::Width(&RenderScoreHud::s_PlayerCountCursor);
        minimum<float>((fVar13 - fVar15) - 1.0,((fVar13 - fVar14) - 16.0) - 6.0);
        CTextCursor::MoveTo((CTextCursor *)
                            CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                            in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8);
        pIVar6 = CComponent::TextRender((CComponent *)0x166076);
        (*(pIVar6->super_IInterface)._vptr_IInterface[0x10])
                  (0x3f800000,pIVar6,&RenderScoreHud::s_PlayerCountCursor,0,0xffffffff);
      }
      for (local_3f8 = 0; local_3f8 < 2; local_3f8 = local_3f8 + 1) {
        local_330 = (((fVar13 - fVar14) - 16.0) - 6.0) - 16.0;
        local_32c = (float)local_3f8 * 20.0 + local_38c;
        local_328 = fVar14 + 16.0 + 6.0 + 16.0;
        local_324 = 0x41900000;
        pIVar7 = CComponent::Graphics((CComponent *)0x166198);
        (*(pIVar7->super_IInterface)._vptr_IInterface[8])();
        if (local_3f8 == local_3d0) {
          vector4_base<float>::vector4_base(&local_340,1.0,1.0,1.0,0.25);
        }
        else {
          vector4_base<float>::vector4_base(&local_340,0.0,0.0,0.0,0.25);
        }
        CUIRect::Draw((CUIRect *)in_stack_fffffffffffffa58,
                      (vec4 *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                      (float)((ulong)in_stack_fffffffffffffa48 >> 0x20),
                      (int)in_stack_fffffffffffffa48);
        in_stack_fffffffffffffa58 = RenderScoreHud::s_ScoreCursors + local_3f8;
        in_stack_fffffffffffffa54 = fVar14;
        CTextCursor::Width(RenderScoreHud::s_ScoreCursors + local_3f8);
        CTextCursor::MoveTo((CTextCursor *)
                            CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                            in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8);
        pIVar6 = CComponent::TextRender((CComponent *)0x16633d);
        (*(pIVar6->super_IInterface)._vptr_IInterface[0x10])
                  (0x3f800000,pIVar6,RenderScoreHud::s_ScoreCursors + local_3f8,0,0xffffffff);
        if (*(long *)&local_1b8.m_aColors[(long)local_3f8 + -2].field_3 != 0) {
          if ((RenderScoreHud()::s_NameCursor == '\0') &&
             (iVar3 = __cxa_guard_acquire(&RenderScoreHud()::s_NameCursor), iVar3 != 0)) {
            CTextCursor::CTextCursor
                      (in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc.y,
                       (int)in_stack_fffffffffffff9f8);
            __cxa_atexit(CTextCursor::~CTextCursor,&RenderScoreHud::s_NameCursor,&__dso_handle);
            __cxa_guard_release(&RenderScoreHud()::s_NameCursor);
          }
          CTextCursor::Reset((CTextCursor *)
                             CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                             CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
          aVar1 = local_1b8.m_aColors[(long)local_3f8 + -1].field_1;
          in_stack_fffffffffffffa48 = local_218;
          pCVar9 = CComponent::Config((CComponent *)0x166435);
          if (pCVar9->m_ClShowsocial == 0) {
            local_5c0 = "";
          }
          else {
            local_5c0 = (char *)(*(long *)(in_RDI + 8) + 0x4540 + (long)(int)aVar1 * 0x5b0);
          }
          uVar18 = 0;
          str_format(in_stack_fffffffffffffa48,0x40,"%s",local_5c0);
          pIVar6 = CComponent::TextRender((CComponent *)0x1664a2);
          pCVar17 = &RenderScoreHud::s_NameCursor;
          aVar19.x = -NAN;
          (*(pIVar6->super_IInterface)._vptr_IInterface[7])
                    (pIVar6,&RenderScoreHud::s_NameCursor,local_218);
          fVar15 = CTextCursor::Width(pCVar17);
          pCVar10 = CComponent::UI((CComponent *)0x1664e8);
          fVar16 = CUI::GetClientIDRectWidth(pCVar10,8.0);
          fVar15 = minimum<float>((fVar13 - (fVar15 + fVar16)) - 1.0,
                                  (((fVar13 - fVar14) - 16.0) - 6.0) - 16.0);
          CComponent::UI((CComponent *)0x1665cd);
          in_stack_fffffffffffff9f8 = RenderScoreHud::s_NameCursor.m_FontSize;
          vector2_base<float>::vector2_base
                    ((vector2_base<float> *)(local_358 + 0x10),fVar15,
                     (float)(local_3f8 + 1) * 20.0 + local_38c + -3.0);
          in_stack_fffffffffffffa00 = (CTextCursor *)local_358;
          aVar20.y = 0.5;
          in_stack_fffffffffffff9fc = aVar1;
          vector4_base<float>::vector4_base
                    ((vector4_base<float> *)in_stack_fffffffffffffa00,1.0,1.0,1.0,0.5);
          this_00 = &local_368;
          vector4_base<float>::vector4_base(this_00,0.1,0.1,0.1,1.0);
          CursorPosition_00.field_1.y = aVar20.y;
          CursorPosition_00.field_0 = aVar19;
          CUI::DrawClientID((CUI *)CONCAT44(uVar18,in_stack_fffffffffffffa18),
                            (float)((ulong)pCVar17 >> 0x20),CursorPosition_00,(int)pCVar17,this_00,
                            (vec4 *)in_stack_fffffffffffffa00);
          CTextCursor::MoveTo((CTextCursor *)
                              CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                              in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8);
          pIVar6 = CComponent::TextRender((CComponent *)0x1666c2);
          (*(pIVar6->super_IInterface)._vptr_IInterface[0x10])
                    (0x3f800000,pIVar6,pCVar17,(ulong)uVar18,(ulong)(uint)aVar19);
          memcpy(local_2b4,(void *)(*(long *)(in_RDI + 8) + 0x49f4 + (long)(int)aVar1 * 0x5b0),0x9c)
          ;
          local_220 = 18.0;
          CComponent::RenderTools((CComponent *)0x166731);
          CAnimState::GetIdle();
          vector2_base<float>::vector2_base(&local_370,1.0,0.0);
          vector2_base<float>::vector2_base
                    (&local_378,((fVar13 - fVar14) - local_220 * aVar20.y) - 3.0,
                     (float)local_3f8 * 20.0 + local_38c + 1.0 + local_220 * aVar20.y);
          CRenderTools::RenderTee
                    ((CRenderTools *)local_540,
                     (CAnimState *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                     in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa4,in_stack_fffffffffffffb68,
                     in_stack_fffffffffffffb60);
        }
        CTextCursor::MoveTo((CTextCursor *)
                            CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                            in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8);
        pIVar6 = CComponent::TextRender((CComponent *)0x1668a2);
        (*(pIVar6->super_IInterface)._vptr_IInterface[0x10])
                  (0x3f800000,pIVar6,RenderScoreHud::s_PositionCursors + local_3f8,0,0xffffffff);
        local_38c = local_38c + 8.0;
      }
    }
    else {
      if ((RenderScoreHud()::s_ExpectedScoreWidth == '\0') &&
         (iVar3 = __cxa_guard_acquire(&RenderScoreHud()::s_ExpectedScoreWidth), iVar3 != 0)) {
        pIVar6 = CComponent::TextRender((CComponent *)0x164425);
        (*(pIVar6->super_IInterface)._vptr_IInterface[6])(0x41600000,pIVar6,"100",0xffffffff);
        RenderScoreHud::s_ExpectedScoreWidth = extraout_XMM0_Da;
        __cxa_guard_release(&RenderScoreHud()::s_ExpectedScoreWidth);
      }
      if ((RenderScoreHud()::s_TeamscoreCursors == '\0') &&
         (iVar3 = __cxa_guard_acquire(&RenderScoreHud()::s_TeamscoreCursors), iVar3 != 0)) {
        local_430 = RenderScoreHud::s_TeamscoreCursors;
        do {
          CTextCursor::CTextCursor(in_stack_fffffffffffff9f0);
          local_430 = local_430 + 1;
        } while (local_430 != (CTextCursor *)&RenderScoreHud()::s_TeamscoreCursors);
        __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
        __cxa_guard_release(&RenderScoreHud()::s_TeamscoreCursors);
      }
      if ((RenderScoreHud()::s_PlayerCountCursors == '\0') &&
         (iVar3 = __cxa_guard_acquire(&RenderScoreHud()::s_PlayerCountCursors), iVar3 != 0)) {
        local_440 = RenderScoreHud::s_PlayerCountCursors;
        do {
          CTextCursor::CTextCursor(in_stack_fffffffffffff9f0);
          local_440 = local_440 + 1;
        } while (local_440 != (CTextCursor *)&RenderScoreHud()::s_PlayerCountCursors);
        __cxa_atexit(__cxx_global_array_dtor_11,0,&__dso_handle);
        __cxa_guard_release(&RenderScoreHud()::s_PlayerCountCursors);
      }
      local_50 = **(uint **)(*(long *)(in_RDI + 8) + 0xe00);
      local_4c = *(uint *)(*(long *)(*(long *)(in_RDI + 8) + 0xe00) + 4);
      str_format(local_48,0x20,"%d",(ulong)local_50);
      str_format(acStack_28,0x20,"%d",(ulong)local_4c);
      for (local_3a0 = 0; local_3a0 < 2; local_3a0 = local_3a0 + 1) {
        RenderScoreHud::s_TeamscoreCursors[local_3a0].m_FontSize = 14.0;
        CTextCursor::Reset((CTextCursor *)
                           CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                           CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
        pIVar6 = CComponent::TextRender((CComponent *)0x164689);
        (*(pIVar6->super_IInterface)._vptr_IInterface[7])
                  (pIVar6,RenderScoreHud::s_TeamscoreCursors + local_3a0,
                   local_48 + (long)local_3a0 * 0x20,0xffffffff);
      }
      fVar14 = CTextCursor::Width(RenderScoreHud::s_TeamscoreCursors);
      fVar15 = CTextCursor::Width(RenderScoreHud::s_TeamscoreCursors + 1);
      fVar14 = maximum<float>(fVar14,fVar15);
      fVar14 = maximum<float>(fVar14,RenderScoreHud::s_ExpectedScoreWidth);
      if ((uVar18 & 2) == 0) {
        local_470 = 3.0;
      }
      else {
        local_470 = 16.0;
      }
      for (local_3b0 = 0; local_3b0 < 2; local_3b0 = local_3b0 + 1) {
        local_2c4 = ((fVar13 - fVar14) - local_470) - 6.0;
        local_2c0 = (float)local_3b0 * 20.0 + local_38c;
        local_2bc = fVar14 + local_470 + 6.0;
        local_2b8 = 0x41900000;
        pIVar7 = CComponent::Graphics((CComponent *)0x16495f);
        (*(pIVar7->super_IInterface)._vptr_IInterface[8])();
        if (local_3b0 == 0) {
          vector4_base<float>::vector4_base(&local_2d4,1.0,0.0,0.0,0.25);
        }
        else {
          vector4_base<float>::vector4_base(&local_2d4,0.0,0.0,1.0,0.25);
        }
        CUIRect::Draw((CUIRect *)in_stack_fffffffffffffa58,
                      (vec4 *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                      (float)((ulong)in_stack_fffffffffffffa48 >> 0x20),
                      (int)in_stack_fffffffffffffa48);
        CTextCursor::Width(RenderScoreHud::s_TeamscoreCursors + local_3b0);
        CTextCursor::MoveTo((CTextCursor *)
                            CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                            in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8);
        pIVar6 = CComponent::TextRender((CComponent *)0x164ab0);
        (*(pIVar6->super_IInterface)._vptr_IInterface[0x10])
                  (0x3f800000,pIVar6,RenderScoreHud::s_TeamscoreCursors + local_3b0,0,0xffffffff);
        if ((uVar18 & 4) != 0) {
          RenderScoreHud::s_PlayerCountCursors[local_3b0].m_FontSize = 8.0;
          if (*(int *)(*(long *)(in_RDI + 8) + 0xe20 + (long)local_3b0 * 4) == 1) {
            in_stack_fffffffffffffb68 =
                 (vec2)Localize((char *)in_stack_fffffffffffff9f0,
                                (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8
                                                ));
          }
          else {
            in_stack_fffffffffffffb68 =
                 (vec2)Localize((char *)in_stack_fffffffffffff9f0,
                                (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8
                                                ));
          }
          str_format(local_78,0x20,(char *)in_stack_fffffffffffffb68,
                     (ulong)*(uint *)(*(long *)(in_RDI + 8) + 0xe20 + (long)local_3b0 * 4));
          CLocalizationDatabase::Version(&g_Localization);
          CTextCursor::Reset((CTextCursor *)
                             CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                             CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
          pIVar6 = CComponent::TextRender((CComponent *)0x164c19);
          (*(pIVar6->super_IInterface)._vptr_IInterface[7])
                    (pIVar6,RenderScoreHud::s_PlayerCountCursors + local_3b0,local_78,0xffffffff);
          in_stack_fffffffffffffb60 = (vec2)(RenderScoreHud::s_PlayerCountCursors + local_3b0);
          fVar15 = CTextCursor::Width(RenderScoreHud::s_PlayerCountCursors + local_3b0);
          minimum<float>((fVar13 - fVar15) - 1.0,((fVar13 - fVar14) - local_470) - 6.0);
          CTextCursor::MoveTo((CTextCursor *)
                              CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                              in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8);
          pIVar6 = CComponent::TextRender((CComponent *)0x164d2a);
          (*(pIVar6->super_IInterface)._vptr_IInterface[0x10])
                    (0x3f800000,pIVar6,RenderScoreHud::s_PlayerCountCursors + local_3b0,0,0xffffffff
                    );
        }
        local_38c = local_38c + 8.0;
      }
      if (((uVar18 & 2) != 0) && (*(long *)(*(long *)(in_RDI + 8) + 0xe08) != 0)) {
        local_88[2] = **(undefined4 **)(*(long *)(in_RDI + 8) + 0xe08);
        local_88[3] = *(undefined4 *)(*(long *)(*(long *)(in_RDI + 8) + 0xe08) + 4);
        local_88[0] = *(int *)(*(long *)(*(long *)(in_RDI + 8) + 0xe08) + 8);
        local_88[1] = *(undefined4 *)(*(long *)(*(long *)(in_RDI + 8) + 0xe08) + 0xc);
        local_38c = 229.0;
        for (local_3b4 = 0; local_3b4 < 2; local_3b4 = local_3b4 + 1) {
          bVar12 = false;
          if (local_88[local_3b4] != 0) {
            pIVar8 = CComponent::Client((CComponent *)0x164e65);
            iVar4 = IClient::GameTick(pIVar8);
            iVar3 = local_88[local_3b4];
            pIVar8 = CComponent::Client((CComponent *)0x164e90);
            iVar5 = IClient::GameTickSpeed(pIVar8);
            bVar12 = 0x18 < (iVar4 - iVar3) / iVar5;
          }
          iVar3 = 0x14;
          if (bVar12) {
            iVar3 = 10;
          }
          if (local_88[(long)local_3b4 + 2] == -2) {
LAB_00164f20:
            pIVar7 = CComponent::Graphics((CComponent *)0x164f2d);
            (*(pIVar7->super_IInterface)._vptr_IInterface[8])();
            pIVar7 = CComponent::Graphics((CComponent *)0x164f43);
            local_2d8 = g_pData->m_aImages[1].m_Id.m_Id;
            (*(pIVar7->super_IInterface)._vptr_IInterface[0x13])(pIVar7,(ulong)local_2d8);
            pIVar7 = CComponent::Graphics((CComponent *)0x164f7b);
            (*(pIVar7->super_IInterface)._vptr_IInterface[0x17])();
            CComponent::RenderTools((CComponent *)0x164f94);
            CRenderTools::SelectSprite
                      ((CRenderTools *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                       in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0
                      );
            IGraphics::CQuadItem::CQuadItem
                      (&local_2e8,(fVar13 - fVar14) - local_470,
                       (float)local_3b4 * 20.0 + local_38c + 1.0,local_470 / 2.0,local_470);
            pIVar7 = CComponent::Graphics((CComponent *)0x165039);
            (*(pIVar7->super_IInterface)._vptr_IInterface[0x1d])(pIVar7,&local_2e8,1);
            pIVar7 = CComponent::Graphics((CComponent *)0x16505f);
            (*(pIVar7->super_IInterface)._vptr_IInterface[0x18])();
          }
          else {
            if (local_88[(long)local_3b4 + 2] == -1) {
              pIVar8 = CComponent::Client((CComponent *)0x164f04);
              iVar4 = IClient::GameTick(pIVar8);
              if ((iVar4 / iVar3 & 1U) != 0) goto LAB_00164f20;
            }
            if (-1 < local_88[(long)local_3b4 + 2]) {
              if ((RenderScoreHud()::s_CarrierCursor == '\0') &&
                 (iVar3 = __cxa_guard_acquire(&RenderScoreHud()::s_CarrierCursor), iVar3 != 0)) {
                CTextCursor::CTextCursor
                          (in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc.y,
                           (int)in_stack_fffffffffffff9f8);
                __cxa_atexit(CTextCursor::~CTextCursor,&RenderScoreHud::s_CarrierCursor,
                             &__dso_handle);
                __cxa_guard_release(&RenderScoreHud()::s_CarrierCursor);
              }
              CTextCursor::Reset((CTextCursor *)
                                 CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                                 CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
              iVar3 = local_88[(long)local_3b4 + 2];
              pCVar9 = CComponent::Config((CComponent *)0x16512c);
              if (pCVar9->m_ClShowsocial == 0) {
                local_4c8 = "";
              }
              else {
                local_4c8 = (char *)(*(long *)(in_RDI + 8) + 0x4540 + (long)(iVar3 % 0x40) * 0x5b0);
              }
              str_format(local_c8,0x40,"%s",local_4c8);
              pIVar6 = CComponent::TextRender((CComponent *)0x1651a8);
              (*(pIVar6->super_IInterface)._vptr_IInterface[7])
                        (pIVar6,&RenderScoreHud::s_CarrierCursor,local_c8);
              fVar15 = CTextCursor::Width(&RenderScoreHud::s_CarrierCursor);
              pCVar10 = CComponent::UI((CComponent *)0x1651fa);
              fVar16 = CUI::GetClientIDRectWidth(pCVar10,8.0);
              fVar15 = minimum<float>((fVar13 - (fVar15 + fVar16)) - 1.0,
                                      ((fVar13 - fVar14) - local_470) - 6.0);
              CComponent::UI((CComponent *)0x1652db);
              vector2_base<float>::vector2_base
                        (&local_2f0,fVar15,(float)(local_3b4 + 1) * 20.0 + local_38c + -3.0);
              vector4_base<float>::vector4_base(&local_300,1.0,1.0,1.0,0.5);
              vector4_base<float>::vector4_base(&local_310,0.1,0.1,0.1,1.0);
              CursorPosition.field_1 = in_stack_fffffffffffffa24;
              CursorPosition.field_0 = in_stack_fffffffffffffa20;
              CUI::DrawClientID((CUI *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18)
                                ,(float)((ulong)in_stack_fffffffffffffa10 >> 0x20),CursorPosition,
                                (int)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,
                                (vec4 *)in_stack_fffffffffffffa00);
              CTextCursor::MoveTo((CTextCursor *)
                                  CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                                  in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8);
              pIVar6 = CComponent::TextRender((CComponent *)0x1653fa);
              (*(pIVar6->super_IInterface)._vptr_IInterface[0x10])
                        (0x3f800000,pIVar6,&RenderScoreHud::s_CarrierCursor,0,0xffffffff);
              memcpy(local_1b8.m_aColors + 2,
                     (void *)(*(long *)(in_RDI + 8) + 0x49f4 + (long)(iVar3 % 0x40) * 0x5b0),0x9c);
              local_d0 = 18.0;
              CComponent::RenderTools((CComponent *)0x165475);
              CAnimState::GetIdle();
              vector2_base<float>::vector2_base(&local_318,1.0,0.0);
              vector2_base<float>::vector2_base
                        (&local_320,((fVar13 - fVar14) - local_d0 * 0.5) - 3.0,
                         (float)local_3b4 * 20.0 + local_38c + 1.0 + local_d0 * 0.5);
              CRenderTools::RenderTee
                        ((CRenderTools *)in_stack_fffffffffffffab8,
                         (CAnimState *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0)
                         ,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa4,
                         in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
            }
          }
          local_38c = local_38c + 8.0;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CHud::RenderScoreHud()
{
	// render small score hud
	if(!(m_pClient->m_Snap.m_pGameData->m_GameStateFlags&(GAMESTATEFLAG_ROUNDOVER|GAMESTATEFLAG_GAMEOVER)))
	{
		int GameFlags = m_pClient->m_GameInfo.m_GameFlags;
		float Whole = 300*Graphics()->ScreenAspect();
		float StartY = 229.0f;
		const float TeamOffset = 20.0f;

		if(GameFlags&GAMEFLAG_TEAMS && m_pClient->m_Snap.m_pGameDataTeam && !(GameFlags&GAMEFLAG_RACE))
		{
			static float s_ExpectedScoreWidth = TextRender()->TextWidth(14.0f, "100", -1);
			static CTextCursor s_TeamscoreCursors[2];
			static CTextCursor s_PlayerCountCursors[2];
		
			char aScoreTeam[2][32];
			int Teamscores[2];
			Teamscores[0] = m_pClient->m_Snap.m_pGameDataTeam->m_TeamscoreRed;
			Teamscores[1] = m_pClient->m_Snap.m_pGameDataTeam->m_TeamscoreBlue;
			str_format(aScoreTeam[TEAM_RED], sizeof(aScoreTeam)/2, "%d", Teamscores[TEAM_RED]);
			str_format(aScoreTeam[TEAM_BLUE], sizeof(aScoreTeam)/2, "%d", Teamscores[TEAM_BLUE]);
			
			for(int t = 0; t < NUM_TEAMS; t++)
			{
				s_TeamscoreCursors[t].m_FontSize = 14.0f;
				s_TeamscoreCursors[t].Reset(Teamscores[t]);
				TextRender()->TextDeferred(&s_TeamscoreCursors[t], aScoreTeam[t], -1);
			}

			float ScoreWidthMax = maximum(maximum(s_TeamscoreCursors[0].Width(), s_TeamscoreCursors[1].Width()), s_ExpectedScoreWidth);
			float Split = 3.0f;
			float ImageSize = GameFlags&GAMEFLAG_FLAGS ? 16.0f : Split;

			for(int t = 0; t < NUM_TEAMS; t++)
			{
				// draw box
				CUIRect Rect = {Whole-ScoreWidthMax-ImageSize-2*Split, StartY+t*TeamOffset, ScoreWidthMax+ImageSize+2*Split, 18.0f};
				Graphics()->BlendNormal();
				Rect.Draw(t == 0 ? vec4(1.0f, 0.0f, 0.0f, 0.25f) : vec4(0.0f, 0.0f, 1.0f, 0.25f), 5.0f, CUIRect::CORNER_L);

				// draw score
				s_TeamscoreCursors[t].MoveTo(Whole-ScoreWidthMax+(ScoreWidthMax-s_TeamscoreCursors[t].Width())/2-Split, StartY+t*TeamOffset);
				TextRender()->DrawTextOutlined(&s_TeamscoreCursors[t]);

				if(GameFlags&GAMEFLAG_SURVIVAL)
				{
					s_PlayerCountCursors[t].m_FontSize = 8.0f;
					char aBuf[32];
					str_format(aBuf, sizeof(aBuf), m_pClient->m_Snap.m_AliveCount[t]==1 ? Localize("%d player left") : Localize("%d players left"),
								m_pClient->m_Snap.m_AliveCount[t]);

					s_PlayerCountCursors[t].Reset(g_Localization.Version() << 8 | m_pClient->m_Snap.m_AliveCount[t]);
					TextRender()->TextDeferred(&s_PlayerCountCursors[t], aBuf, -1);
					s_PlayerCountCursors[t].MoveTo(minimum(Whole-s_PlayerCountCursors[t].Width()-1.0f, Whole-ScoreWidthMax-ImageSize-2*Split), StartY+(t+1)*TeamOffset-3.0f);
					TextRender()->DrawTextOutlined(&s_PlayerCountCursors[t]);
				}
				StartY += 8.0f;
			}

			if(GameFlags&GAMEFLAG_FLAGS && m_pClient->m_Snap.m_pGameDataFlag)
			{
				int FlagCarrier[2] = { m_pClient->m_Snap.m_pGameDataFlag->m_FlagCarrierRed, m_pClient->m_Snap.m_pGameDataFlag->m_FlagCarrierBlue };
				int FlagDropTick[2] = { m_pClient->m_Snap.m_pGameDataFlag->m_FlagDropTickRed, m_pClient->m_Snap.m_pGameDataFlag->m_FlagDropTickBlue };
				StartY = 229.0f;

				for(int t = 0; t < 2; t++)
				{
					int BlinkTimer = (FlagDropTick[t] != 0 && (Client()->GameTick()-FlagDropTick[t])/Client()->GameTickSpeed() >= 25) ? 10 : 20;
					if(FlagCarrier[t] == FLAG_ATSTAND || (FlagCarrier[t] == FLAG_TAKEN && ((Client()->GameTick()/BlinkTimer)&1)))
					{
						// draw flag
						Graphics()->BlendNormal();
						Graphics()->TextureSet(g_pData->m_aImages[IMAGE_GAME].m_Id);
						Graphics()->QuadsBegin();
						RenderTools()->SelectSprite(t==0?SPRITE_FLAG_RED:SPRITE_FLAG_BLUE);
						IGraphics::CQuadItem QuadItem(Whole-ScoreWidthMax-ImageSize, StartY+1.0f+t*TeamOffset, ImageSize/2, ImageSize);
						Graphics()->QuadsDrawTL(&QuadItem, 1);
						Graphics()->QuadsEnd();
					}
					else if(FlagCarrier[t] >= 0)
					{
						// draw name
						static CTextCursor s_CarrierCursor(8.0f);
						s_CarrierCursor.Reset();

						int ID = FlagCarrier[t]%MAX_CLIENTS;
						char aName[64];
						str_format(aName, sizeof(aName), "%s", Config()->m_ClShowsocial ? m_pClient->m_aClients[ID].m_aName : "");

						TextRender()->TextDeferred(&s_CarrierCursor, aName, -1);

						float w = s_CarrierCursor.Width() + UI()->GetClientIDRectWidth(8.0f);
						float x = minimum(Whole-w-1.0f, Whole-ScoreWidthMax-ImageSize-2*Split);
						float y = StartY+(t+1)*TeamOffset-3.0f;
						
						float AdvanceID = UI()->DrawClientID(s_CarrierCursor.m_FontSize, vec2(x, y), ID);
						s_CarrierCursor.MoveTo(x + AdvanceID, y);
						TextRender()->DrawTextOutlined(&s_CarrierCursor);

						// draw tee of the flag holder
						CTeeRenderInfo Info = m_pClient->m_aClients[ID].m_RenderInfo;
						Info.m_Size = 18.0f;
						RenderTools()->RenderTee(CAnimState::GetIdle(), &Info, EMOTE_NORMAL, vec2(1,0),
							vec2(Whole-ScoreWidthMax-Info.m_Size/2-Split, StartY+1.0f+Info.m_Size/2+t*TeamOffset));
					}
					StartY += 8.0f;
				}
			}
		}
		else
		{
			int Local = -1;
			int aPos[2] = { 1, 2 };
			CGameClient::CPlayerInfoItem aPlayerInfo[2] = {{0}};
			int i = 0;
			for(int t = 0; t < 2 && i < MAX_CLIENTS && m_pClient->m_Snap.m_aInfoByScore[i].m_pPlayerInfo; ++i)
			{
				if(m_pClient->m_aClients[m_pClient->m_Snap.m_aInfoByScore[i].m_ClientID].m_Team != TEAM_SPECTATORS)
				{
					aPlayerInfo[t] = m_pClient->m_Snap.m_aInfoByScore[i];
					if(aPlayerInfo[t].m_ClientID == m_pClient->m_LocalClientID)
						Local = t;
					++t;
				}
			}
			// search local player info if not a spectator, nor within top2 scores
			if(Local == -1 && m_pClient->m_LocalClientID != -1 && m_pClient->m_aClients[m_pClient->m_LocalClientID].m_Team != TEAM_SPECTATORS)
			{
				for(; i < MAX_CLIENTS && m_pClient->m_Snap.m_aInfoByScore[i].m_pPlayerInfo; ++i)
				{
					if(m_pClient->m_aClients[m_pClient->m_Snap.m_aInfoByScore[i].m_ClientID].m_Team != TEAM_SPECTATORS)
						++aPos[1];
					if(m_pClient->m_Snap.m_aInfoByScore[i].m_ClientID == m_pClient->m_LocalClientID)
					{
						aPlayerInfo[1] = m_pClient->m_Snap.m_aInfoByScore[i];
						Local = 1;
						break;
					}
				}
			}

			float FontSize = (GameFlags&GAMEFLAG_RACE) ? 10.f : 14.f;
			static CTextCursor s_ScoreCursors[2];
			static CTextCursor s_PositionCursors[2];
			char aBuf[32];
			for(int t = 0; t < 2; ++t)
			{
				s_ScoreCursors[t].m_FontSize = FontSize;
				if(aPlayerInfo[t].m_pPlayerInfo)
				{
					if(GameFlags&GAMEFLAG_RACE)
						FormatTime(aBuf, sizeof(aBuf), aPlayerInfo[t].m_pPlayerInfo->m_Score, m_pClient->RacePrecision());
					else
						str_format(aBuf, sizeof(aBuf), "%d", aPlayerInfo[t].m_pPlayerInfo->m_Score);
					s_ScoreCursors[t].Reset(aPlayerInfo[t].m_pPlayerInfo->m_Score);
				}
				else
				{
					aBuf[0] = 0;
					s_ScoreCursors[t].Reset();
				}

				TextRender()->TextDeferred(&s_ScoreCursors[t], aBuf, -1);

				s_PositionCursors[t].Reset(0);
				str_format(aBuf, sizeof(aBuf), "%d.", aPos[t]);
				s_PositionCursors[t].m_FontSize = 10.0f;
				TextRender()->TextDeferred(&s_PositionCursors[t], aBuf, -1);
			}

			float ScoreWidthMax = maximum(maximum(s_ScoreCursors[0].Width(), s_ScoreCursors[1].Width()), TextRender()->TextWidth(FontSize, "10", -1));
			float Split = 3.0f, ImageSize = 16.0f, PosSize = 16.0f;

			if(GameFlags&GAMEFLAG_SURVIVAL)
			{
				// draw number of alive players
				static CTextCursor s_PlayerCountCursor(8.0f);
				char aBuf[32];
				str_format(aBuf, sizeof(aBuf), m_pClient->m_Snap.m_AliveCount[0] == 1 ? Localize("%d player left") : Localize("%d players left"),
					m_pClient->m_Snap.m_AliveCount[0]);
				s_PlayerCountCursor.Reset(g_Localization.Version() << 8 | m_pClient->m_Snap.m_AliveCount[0]);
				TextRender()->TextDeferred(&s_PlayerCountCursor, aBuf, -1);
				float w = s_PlayerCountCursor.Width();
				s_PlayerCountCursor.MoveTo(minimum(Whole - w - 1.0f, Whole - ScoreWidthMax - ImageSize - 2 * Split), StartY - 12.0f);
				TextRender()->DrawTextOutlined(&s_PlayerCountCursor);
			}

			for(int t = 0; t < 2; t++)
			{
				// draw box
				CUIRect Rect = {Whole-ScoreWidthMax-ImageSize-2*Split-PosSize, StartY+t*TeamOffset, ScoreWidthMax+ImageSize+2*Split+PosSize, 18.0f};
				Graphics()->BlendNormal();
				Rect.Draw(t == Local ? vec4(1.0f, 1.0f, 1.0f, 0.25f) : vec4(0.0f, 0.0f, 0.0f, 0.25f), 5.0f, CUIRect::CORNER_L);

				// draw score
				float Spacing = (GameFlags&GAMEFLAG_RACE) ? 2.f : 0.f;
				s_ScoreCursors[t].MoveTo(Whole-ScoreWidthMax+(ScoreWidthMax-s_ScoreCursors[t].Width())/2-Split, StartY+t*TeamOffset+Spacing);
				TextRender()->DrawTextOutlined(&s_ScoreCursors[t]);

				if(aPlayerInfo[t].m_pPlayerInfo)
				{
					// draw name
					static CTextCursor s_NameCursor(8.0f);
					s_NameCursor.Reset();

					int ID = aPlayerInfo[t].m_ClientID;
					char aName[64];
					str_format(aName, sizeof(aName), "%s", Config()->m_ClShowsocial ? m_pClient->m_aClients[ID].m_aName : "");

					TextRender()->TextDeferred(&s_NameCursor, aName, -1);

					float w = s_NameCursor.Width() + UI()->GetClientIDRectWidth(8.0f);
					float x = minimum(Whole-w-1.0f, Whole-ScoreWidthMax-ImageSize-2*Split-PosSize);
					float y = StartY+(t+1)*TeamOffset-3.0f;

					float AdvanceID = UI()->DrawClientID(s_NameCursor.m_FontSize, vec2(x, y), ID);
					s_NameCursor.MoveTo(x + AdvanceID, y);
					TextRender()->DrawTextOutlined(&s_NameCursor);

					// draw tee
					CTeeRenderInfo Info = m_pClient->m_aClients[ID].m_RenderInfo;
					Info.m_Size = 18.0f;
					RenderTools()->RenderTee(CAnimState::GetIdle(), &Info, EMOTE_NORMAL, vec2(1,0),
						vec2(Whole-ScoreWidthMax-Info.m_Size/2-Split, StartY+1.0f+Info.m_Size/2+t*TeamOffset));
				}

				// draw position
				s_PositionCursors[t].MoveTo(Whole-ScoreWidthMax-ImageSize-Split-PosSize, StartY+2.0f+t*TeamOffset);
				TextRender()->DrawTextOutlined(&s_PositionCursors[t]);

				StartY += 8.0f;
			}
		}
	}
}